

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::Vector<kj::String>const&>
          (String *__return_storage_ptr__,kj *this,Vector<kj::String> *params)

{
  kj *this_00;
  Vector<kj::String> *value;
  Delimited<kj::ArrayPtr<const_kj::String>_> *params_00;
  Delimited<kj::ArrayPtr<const_kj::String>_> local_50;
  kj *local_18;
  Vector<kj::String> *params_local;
  
  local_18 = this;
  params_local = (Vector<kj::String> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::Vector<kj::String>const&>((Vector<kj::String> *)this);
  toCharSequence<kj::Vector<kj::String>const&>(&local_50,this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<kj::String_const>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<const_kj::String>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}